

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m256v.c
# Opt level: O0

void m256v_multadd_row_from(m256v *M1,int r1,int offs,uint8_t alpha,m256v *Mt,int rt)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  uint8_t *puVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  uint8_t in_CL;
  int in_EDX;
  int in_ESI;
  m256v *in_RDI;
  m256v *in_R8;
  int in_R9D;
  uint8_t ve;
  uint8_t *end_1;
  uint8_t *t_1;
  uint8_t *s_1;
  int log_alpha;
  uint8_t *end;
  uint8_t *t;
  uint8_t *s;
  byte *local_58;
  uint8_t *local_50;
  byte *local_38;
  byte *local_30;
  
  if (in_CL != '\0') {
    if (in_CL == '\x01') {
      puVar1 = in_RDI->e;
      sVar7 = m256v_get_el_offs(in_RDI,in_ESI,in_EDX);
      puVar2 = in_R8->e;
      sVar8 = m256v_get_el_offs(in_R8,in_R9D,in_EDX);
      puVar3 = in_RDI->e;
      sVar9 = m256v_get_el_offs(in_RDI,in_ESI,in_RDI->n_col);
      local_38 = puVar2 + sVar8;
      local_30 = puVar1 + sVar7;
      while (local_30 < puVar3 + sVar9) {
        *local_38 = *local_38 ^ *local_30;
        local_38 = local_38 + 1;
        local_30 = local_30 + 1;
      }
    }
    else {
      iVar5 = gf256_log(in_CL);
      puVar1 = in_RDI->e;
      sVar7 = m256v_get_el_offs(in_RDI,in_ESI,in_EDX);
      puVar2 = in_R8->e;
      sVar8 = m256v_get_el_offs(in_R8,in_R9D,in_EDX);
      local_58 = puVar2 + sVar8;
      puVar2 = in_RDI->e;
      sVar8 = m256v_get_el_offs(in_RDI,in_ESI,in_RDI->n_col);
      local_50 = puVar1 + sVar7;
      while (local_50 < puVar2 + sVar8) {
        if (*local_50 != '\0') {
          iVar6 = gf256_log(*local_50);
          bVar4 = gf256_exp(iVar5 + iVar6);
          *local_58 = *local_58 ^ bVar4;
        }
        local_58 = local_58 + 1;
        local_50 = local_50 + 1;
      }
    }
  }
  return;
}

Assistant:

void m256v_multadd_row_from(const m256v* M1,
			int r1,
			int offs,
			uint8_t alpha,
			m256v* Mt,
			int rt)
{
	assert (M1->n_col == Mt->n_col);

	if (alpha == 0)
		return;
	if (alpha == 1) {
		uint8_t* s = M1->e + get_el_offs(M1, r1, offs);
		uint8_t* t = Mt->e + get_el_offs(Mt, rt, offs);
		uint8_t* end = M1->e + get_el_offs(M1, r1, M1->n_col);
		while (s < end) {
			*t++ ^= *s++;
		}
	} else {
		const int log_alpha = flog(alpha);
		uint8_t* s = M1->e + get_el_offs(M1, r1, offs);
		uint8_t* t = Mt->e + get_el_offs(Mt, rt, offs);
		uint8_t* end = M1->e + get_el_offs(M1, r1, M1->n_col);
		while (s < end) {
			/* Mt[rt, i] += exp(log_alpha + log(M1[r1, i]))
			 * if said logarithm is defined.
			 *
			 * Otherwise, M[rt, i] is unchanged.
			 */
			const uint8_t ve = *s++;
			if (ve != 0) {
				*t ^= fexp(log_alpha + flog(ve));
			}
			++t;
		}
	}
}